

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

unsigned_long ENTROPY_DEBUG(char *label,unsigned_long entropy)

{
  char *pcVar1;
  
  pcVar1 = getenv("EXPAT_ENTROPY_DEBUG");
  if (((pcVar1 != (char *)0x0) && (*pcVar1 == '1')) && (pcVar1[1] == '\0')) {
    fprintf(_stderr,"Entropy: %s --> 0x%0*lx (%lu bytes)\n",label,0x10,entropy,8);
  }
  return entropy;
}

Assistant:

static unsigned long
ENTROPY_DEBUG(const char * label, unsigned long entropy) {
  const char * const EXPAT_ENTROPY_DEBUG = getenv("EXPAT_ENTROPY_DEBUG");
  if (EXPAT_ENTROPY_DEBUG && ! strcmp(EXPAT_ENTROPY_DEBUG, "1")) {
    fprintf(stderr, "Entropy: %s --> 0x%0*lx (%lu bytes)\n",
        label,
        (int)sizeof(entropy) * 2, entropy,
        (unsigned long)sizeof(entropy));
  }
  return entropy;
}